

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lifetime.h
# Opt level: O3

void __thiscall Lifetime::AddToUseCount(Lifetime *this,uint32 newUseValue,Loop *loop,Func *func)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint32 *__s;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  uint32 *puVar9;
  
  uVar6 = this->useCount;
  if (CARRY4(uVar6,newUseValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                       ,0x5e,"((this->useCount + newUseValue) >= this->useCount)",
                       "(this->useCount + newUseValue) >= this->useCount");
    if (!bVar3) goto LAB_0058c779;
    *puVar5 = 0;
    uVar6 = this->useCount;
  }
  this->useCount = uVar6 + newUseValue;
  if (loop != (Loop *)0x0) {
    puVar9 = this->regionUseCount;
    if (puVar9 == (uint32 *)0x0) {
      puVar9 = (uint32 *)&DAT_00000008;
      uVar6 = func->loopCount + 1;
      if (uVar6 != 0) {
        pJVar1 = this->alloc;
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_0058c779;
          *puVar5 = 0;
        }
        uVar7 = (ulong)uVar6;
        sVar8 = uVar7 * 4;
        puVar9 = (uint32 *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pJVar1,sVar8);
        memset(puVar9,0,sVar8);
        memset(puVar9 + uVar7,0,(sVar8 + 0xf & 0x7fffffff0) + uVar7 * -4);
        if (puVar9 == (uint32 *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_0058c779;
          *puVar5 = 0;
          puVar9 = (uint32 *)0x0;
        }
      }
      __s = (uint32 *)&DAT_00000008;
      this->regionUseCount = puVar9;
      uVar6 = func->loopCount + 1;
      if (uVar6 != 0) {
        pJVar1 = this->alloc;
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_0058c779;
          *puVar5 = 0;
        }
        uVar7 = (ulong)uVar6;
        sVar8 = uVar7 * 4;
        __s = (uint32 *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar1,sVar8);
        memset(__s,0,sVar8);
        memset(__s + uVar7,0,(sVar8 + 0xf & 0x7fffffff0) + uVar7 * -4);
        if (__s == (uint32 *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) {
LAB_0058c779:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
          __s = (uint32 *)0x0;
        }
      }
      this->regionUseCountAdjust = __s;
      puVar9 = this->regionUseCount;
    }
    do {
      puVar9[loop->loopNumber] = puVar9[loop->loopNumber] + newUseValue;
      loop = loop->parent;
    } while (loop != (Loop *)0x0);
  }
  return;
}

Assistant:

void AddToUseCount(uint32 newUseValue, Loop *loop, Func *func)
    {
        Assert((this->useCount + newUseValue) >= this->useCount);
        this->useCount += newUseValue;

        if (loop)
        {
            if (!this->regionUseCount)
            {
                this->regionUseCount = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
                this->regionUseCountAdjust = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
            }
            while (loop)
            {
                this->regionUseCount[loop->loopNumber] += newUseValue;
                loop = loop->parent;
            }
        }
    }